

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_r3411_2012.c
# Opt level: O1

void LPSX(u64 *out,u64 *a,u64 *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  
  uVar5 = *b ^ *a;
  uVar15 = b[1] ^ a[1];
  uVar3 = b[2] ^ a[2];
  uVar7 = b[3] ^ a[3];
  uVar6 = b[4] ^ a[4];
  uVar4 = b[5] ^ a[5];
  uVar2 = b[6] ^ a[6];
  uVar1 = b[7] ^ a[7];
  *out = streebog_table[1][(uint)uVar15 & 0xff] ^ streebog_table[0][(uint)uVar5 & 0xff] ^
         streebog_table[2][(uint)uVar3 & 0xff] ^ streebog_table[3][(uint)uVar7 & 0xff] ^
         streebog_table[4][(uint)uVar6 & 0xff] ^ streebog_table[5][(uint)uVar4 & 0xff] ^
         streebog_table[6][(uint)uVar2 & 0xff] ^ streebog_table[7][(uint)uVar1 & 0xff];
  out[1] = streebog_table[1][(uint)(uVar15 >> 8) & 0xff] ^
           streebog_table[0][(uint)(uVar5 >> 8) & 0xff] ^
           streebog_table[2][(uint)(uVar3 >> 8) & 0xff] ^
           streebog_table[3][(uint)(uVar7 >> 8) & 0xff] ^
           streebog_table[4][(uint)(uVar6 >> 8) & 0xff] ^
           streebog_table[5][(uint)(uVar4 >> 8) & 0xff] ^
           streebog_table[6][(uint)(uVar2 >> 8) & 0xff] ^
           streebog_table[7][(uint)(uVar1 >> 8) & 0xff];
  out[2] = *(ulong *)((long)streebog_table[1] + (ulong)((uint)(uVar15 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[0] + (ulong)((uint)(uVar5 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[2] + (ulong)((uint)(uVar3 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[3] + (ulong)((uint)(uVar7 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[4] + (ulong)((uint)(uVar6 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[5] + (ulong)((uint)(uVar4 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[6] + (ulong)((uint)(uVar2 >> 0xd) & 0x7f8)) ^
           *(ulong *)((long)streebog_table[7] + (ulong)((uint)(uVar1 >> 0xd) & 0x7f8));
  out[3] = streebog_table[1][uVar15 >> 0x18 & 0xff] ^ streebog_table[0][uVar5 >> 0x18 & 0xff] ^
           streebog_table[2][uVar3 >> 0x18 & 0xff] ^ streebog_table[3][uVar7 >> 0x18 & 0xff] ^
           streebog_table[4][uVar6 >> 0x18 & 0xff] ^ streebog_table[5][uVar4 >> 0x18 & 0xff] ^
           streebog_table[6][uVar2 >> 0x18 & 0xff] ^ streebog_table[7][uVar1 >> 0x18 & 0xff];
  uVar8 = (uint)(uVar5 >> 0x20);
  uVar16 = (uint)(uVar15 >> 0x20);
  uVar9 = (uint)(uVar3 >> 0x20);
  uVar10 = (uint)(uVar7 >> 0x20);
  uVar11 = (uint)(uVar6 >> 0x20);
  uVar12 = (uint)(uVar4 >> 0x20);
  uVar13 = (uint)(uVar2 >> 0x20);
  uVar14 = (uint)(uVar1 >> 0x20);
  out[4] = streebog_table[1][uVar16 & 0xff] ^ streebog_table[0][uVar8 & 0xff] ^
           streebog_table[2][uVar9 & 0xff] ^ streebog_table[3][uVar10 & 0xff] ^
           streebog_table[4][uVar11 & 0xff] ^ streebog_table[5][uVar12 & 0xff] ^
           streebog_table[6][uVar13 & 0xff] ^ streebog_table[7][uVar14 & 0xff];
  out[5] = streebog_table[1][uVar16 >> 8 & 0xff] ^ streebog_table[0][uVar8 >> 8 & 0xff] ^
           streebog_table[2][uVar9 >> 8 & 0xff] ^ streebog_table[3][uVar10 >> 8 & 0xff] ^
           streebog_table[4][uVar11 >> 8 & 0xff] ^ streebog_table[5][uVar12 >> 8 & 0xff] ^
           streebog_table[6][uVar13 >> 8 & 0xff] ^ streebog_table[7][uVar14 >> 8 & 0xff];
  out[6] = streebog_table[1][(ushort)(uVar15 >> 0x30) & 0xff] ^
           streebog_table[0][(ushort)(uVar5 >> 0x30) & 0xff] ^
           streebog_table[2][(ushort)(uVar3 >> 0x30) & 0xff] ^
           streebog_table[3][(ushort)(uVar7 >> 0x30) & 0xff] ^
           streebog_table[4][(ushort)(uVar6 >> 0x30) & 0xff] ^
           streebog_table[5][(ushort)(uVar4 >> 0x30) & 0xff] ^
           streebog_table[6][(ushort)(uVar2 >> 0x30) & 0xff] ^
           streebog_table[7][(ushort)(uVar1 >> 0x30) & 0xff];
  out[7] = streebog_table[1][uVar15 >> 0x38] ^ streebog_table[0][uVar5 >> 0x38] ^
           streebog_table[2][uVar3 >> 0x38] ^ streebog_table[3][uVar7 >> 0x38] ^
           streebog_table[4][uVar6 >> 0x38] ^ streebog_table[5][uVar4 >> 0x38] ^
           streebog_table[6][uVar2 >> 0x38] ^ streebog_table[7][uVar1 >> 0x38];
  return;
}

Assistant:

static inline void LPSX (u64 *out, const u64 *a, const u64 *b)
{
  u64 temp[8];
#ifdef LISSI_DEBUG
  int i;
  printf("LPSX\n");
#endif
  temp[0] = a[0] ^ b[0];
  temp[1] = a[1] ^ b[1];
  temp[2] = a[2] ^ b[2];
  temp[3] = a[3] ^ b[3];
  temp[4] = a[4] ^ b[4];
  temp[5] = a[5] ^ b[5];
  temp[6] = a[6] ^ b[6];
  temp[7] = a[7] ^ b[7];
  strido (out, temp, 0);
  strido (out, temp, 1);
  strido (out, temp, 2);
  strido (out, temp, 3);
  strido (out, temp, 4);
  strido (out, temp, 5);
  strido (out, temp, 6);
  strido (out, temp, 7);
#ifdef LISSI_DEBUG
  for (i=0; i<8; i++){
    printf("0x%llX\n", out[i]);
  }
#endif
}